

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool.c
# Opt level: O3

tool_t * create_tool(char *tool_name)

{
  tool_t *ptVar1;
  tool_t **pptVar2;
  tool_t *ptVar3;
  tool_t *ptVar4;
  
  if (0 < debug_level) {
    create_tool_cold_1();
  }
  ptVar1 = (tool_t *)malloc(0x58);
  if (ptVar1 == (tool_t *)0x0) {
    if (debug_level != 0) {
      create_tool_cold_3();
    }
  }
  else {
    ptVar1->tool_name = tool_name;
    ptVar1->binding = (binding_t *)0x0;
    (ptVar1->config).priority = -1;
    pptVar2 = &tools;
    if (tools == (tool_t *)0x0) {
      ptVar4 = (tool_t *)0x0;
    }
    else {
      ptVar4 = tools;
      if ((tools->config).priority < -1) {
        do {
          ptVar3 = ptVar4;
          ptVar4 = ptVar3->next_tool;
          if (ptVar4 == (tool_t *)0x0) {
            ptVar4 = (tool_t *)0x0;
            break;
          }
        } while ((ptVar4->config).priority < -1);
        pptVar2 = &ptVar3->next_tool;
      }
    }
    ptVar1->next_tool = ptVar4;
    *pptVar2 = ptVar1;
    ptVar1->parent_tool = (tool_t *)0x0;
    create_hashtable(&ptVar1->child_tools,0x18,strhash,strcmp);
    if (0 < debug_level) {
      create_tool_cold_2();
    }
  }
  return ptVar1;
}

Assistant:

tool_t *create_tool(const char *tool_name)
{
   debug_printf(1, "Found no existing tool with name %s\n",tool_name);
   // TODO: ensure free
   tool_t *newtool = (tool_t *) gotcha_malloc(sizeof(tool_t));
   if (!newtool) {
      error_printf("Failed to malloc tool %s\n", tool_name);
      return NULL;
   }
   newtool->tool_name = tool_name;
   newtool->binding = NULL;
   //newtool->next_tool = tools;
   newtool->config = get_default_configuration();
   reorder_tool(newtool);
   newtool->parent_tool = NULL;
   create_hashtable(&newtool->child_tools, 24, 
     (hash_func_t) strhash, (hash_cmp_t) gotcha_strcmp);
   //tools = newtool;
   debug_printf(1, "Created new tool %s\n", tool_name);
   return newtool;
}